

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O0

MatrixXd * __thiscall
LayerConv::img2mat(MatrixXd *__return_storage_ptr__,LayerConv *this,ImageVolume *input,
                  LayerSize *output_size,size_t f,int p,int s)

{
  long cols_00;
  const_reference pvVar1;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pPVar2;
  Index blockRows;
  Index blockCols;
  long lVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  BlockXpr local_1b8;
  BlockXpr local_180;
  undefined1 local_148 [8];
  MatrixXd v;
  int local_128;
  int j;
  int row;
  int i;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_e8;
  value_type *channel;
  int local_d8;
  int c;
  int img_ind;
  Scalar local_c8;
  ConstantReturnType local_c0;
  undefined1 local_a1;
  Scalar local_a0;
  ConstantReturnType local_98;
  undefined1 local_80 [8];
  MatrixXd channel_pad;
  unsigned_long cols_input_mat;
  size_type rows_input_mat;
  Index conv_size;
  Index cols;
  Index rows;
  size_t f_size;
  int p_local;
  size_t f_local;
  LayerSize *output_size_local;
  ImageVolume *input_local;
  LayerConv *this_local;
  MatrixXd *input_mat;
  
  cols_00 = f * f;
  pvVar1 = std::
           vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
           ::operator[](input,0);
  pPVar2 = &std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::operator[](pvVar1,0)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  ;
  blockRows = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar2);
  pvVar1 = std::
           vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
           ::operator[](input,0);
  pPVar2 = &std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::operator[](pvVar1,0)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  ;
  blockCols = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar2);
  lVar3 = output_size->rows * output_size->cols;
  sVar4 = std::
          vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
          ::size(input);
  pvVar1 = std::
           vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
           ::operator[](input,0);
  sVar5 = std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(pvVar1);
  channel_pad.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       sVar5 * cols_00;
  local_a0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_98,blockRows + p * 2,blockCols + p * 2,&local_a0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_98);
  local_a1 = 0;
  local_c8 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_c0,lVar3 * sVar4,
             channel_pad.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols,&local_c8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_c0);
  for (local_d8 = 0; uVar6 = (ulong)local_d8,
      sVar4 = std::
              vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
              ::size(input), uVar6 < sVar4; local_d8 = local_d8 + 1) {
    channel._4_4_ = 0;
    while( true ) {
      uVar6 = (ulong)channel._4_4_;
      pvVar1 = std::
               vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
               ::operator[](input,0);
      sVar4 = std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::size(pvVar1);
      if (sVar4 <= uVar6) break;
      pvVar1 = std::
               vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
               ::operator[](input,(long)local_d8);
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[](pvVar1,(long)channel._4_4_);
      local_e8 = other;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                ((BlockXpr *)&row,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80,
                 (long)p,(long)p,blockRows,blockCols);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&row,other);
      local_128 = 0;
      for (j = 0; (long)j < output_size->rows; j = s + j) {
        for (v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
             _4_4_ = 0;
            (long)v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols._4_4_ < output_size->cols;
            v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
            _4_4_ = s + v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols._4_4_) {
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                    (&local_180,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80,
                     (long)j,(long)v.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols._4_4_,f,f);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_148,
                     (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                      *)&local_180);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transposeInPlace
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_148);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_148,1,
                     cols_00);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                    (&local_1b8,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
                     local_d8 * lVar3 + (long)local_128,channel._4_4_ * cols_00,1,cols_00);
          Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                    ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_1b8,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_148);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_148);
          local_128 = local_128 + 1;
        }
      }
      channel._4_4_ = channel._4_4_ + 1;
    }
  }
  local_a1 = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd LayerConv::img2mat(const ImageVolume& input, const LayerSize& output_size, size_t f, int p, int s) {
	auto f_size = f * f; // filter total size.
	auto rows = input[0][0].rows();
	auto cols = input[0][0].cols();
	auto conv_size = output_size.rows * output_size.cols;
	auto rows_input_mat = conv_size * input.size();
	auto cols_input_mat = input[0].size() * f_size;
	MatrixXd channel_pad = MatrixXd::Constant(rows + 2 * p, cols + 2 * p, 0);
	MatrixXd input_mat = MatrixXd::Constant(rows_input_mat, cols_input_mat, 0);
	for (auto img_ind = 0; img_ind < input.size(); img_ind++) {
		for (auto c = 0; c < input[0].size(); c++) {
			auto& channel = input[img_ind][c];
			channel_pad.block(p, p, rows, cols) = channel;
			for (int i = 0, row = 0; i < output_size.rows; i += s) {
				for (int j = 0; j < output_size.cols; j += s, row++) {
					MatrixXd v = channel_pad.block(i, j, f, f);
					v.transposeInPlace();
					v.resize(1, f_size);
					input_mat.block(img_ind * conv_size + row, c * f_size, 1, f_size) = v;
				}
			}
		}
	}

	return input_mat;
}